

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O1

void GD::vec_add_multipredict<sparse_parameters>
               (multipredict_info<sparse_parameters> *mp,float fx,uint64_t fi)

{
  ulong uVar1;
  sparse_parameters *psVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __hash_code __code;
  _Hash_node_base *p_Var6;
  float **ppfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  polyprediction *ppVar12;
  __node_base_ptr p_Var13;
  
  if (1e-10 <= ABS(fx)) {
    uVar1 = mp->weights->_weight_mask;
    ppVar12 = mp->pred;
    uVar11 = fi & uVar1;
    uVar10 = (mp->count - 1) * mp->step + uVar11;
    if (uVar1 < uVar10) {
      if (mp->count != 0) {
        uVar10 = 0;
        do {
          psVar2 = mp->weights;
          p_Var6 = (_Hash_node_base *)(psVar2->_weight_mask & uVar11 & uVar1);
          uVar9 = (psVar2->_map)._M_h._M_bucket_count;
          uVar8 = (ulong)p_Var6 % uVar9;
          p_Var3 = (psVar2->_map)._M_h._M_buckets[uVar8];
          p_Var5 = (__node_base_ptr)0x0;
          if ((p_Var3 != (__node_base_ptr)0x0) &&
             (p_Var5 = p_Var3, p_Var13 = p_Var3->_M_nxt, p_Var6 != p_Var3->_M_nxt[1]._M_nxt)) {
            while (p_Var4 = p_Var13->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
              p_Var5 = (__node_base_ptr)0x0;
              if (((ulong)p_Var4[1]._M_nxt % uVar9 != uVar8) ||
                 (p_Var5 = p_Var13, p_Var13 = p_Var4, p_Var6 == p_Var4[1]._M_nxt))
              goto LAB_0016ca27;
            }
            p_Var5 = (__node_base_ptr)0x0;
          }
LAB_0016ca27:
          if (p_Var5 == (__node_base_ptr)0x0) {
            p_Var6 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var6 = p_Var5->_M_nxt;
          }
          ppfVar7 = (float **)(p_Var6 + 2);
          if (p_Var6 == (_Hash_node_base *)0x0) {
            ppfVar7 = &psVar2->default_value;
          }
          ppVar12->scalar = *(float *)&((_Hash_node_base *)*ppfVar7)->_M_nxt * fx + ppVar12->scalar;
          uVar11 = (uVar11 & uVar1) + mp->step;
          uVar10 = uVar10 + 1;
          ppVar12 = ppVar12 + 1;
        } while (uVar10 < mp->count);
      }
    }
    else {
      for (; uVar11 <= uVar10; uVar11 = uVar11 + mp->step) {
        psVar2 = mp->weights;
        p_Var6 = (_Hash_node_base *)(psVar2->_weight_mask & uVar11);
        uVar1 = (psVar2->_map)._M_h._M_bucket_count;
        uVar9 = (ulong)p_Var6 % uVar1;
        p_Var3 = (psVar2->_map)._M_h._M_buckets[uVar9];
        p_Var5 = (__node_base_ptr)0x0;
        if ((p_Var3 != (__node_base_ptr)0x0) &&
           (p_Var5 = p_Var3, p_Var13 = p_Var3->_M_nxt, p_Var6 != p_Var3->_M_nxt[1]._M_nxt)) {
          while (p_Var4 = p_Var13->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var5 = (__node_base_ptr)0x0;
            if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar9) ||
               (p_Var5 = p_Var13, p_Var13 = p_Var4, p_Var6 == p_Var4[1]._M_nxt)) goto LAB_0016cade;
          }
          p_Var5 = (__node_base_ptr)0x0;
        }
LAB_0016cade:
        if (p_Var5 == (__node_base_ptr)0x0) {
          p_Var6 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var6 = p_Var5->_M_nxt;
        }
        ppfVar7 = (float **)(p_Var6 + 2);
        if (p_Var6 == (_Hash_node_base *)0x0) {
          ppfVar7 = &psVar2->default_value;
        }
        ppVar12->scalar = *(float *)&((_Hash_node_base *)*ppfVar7)->_M_nxt * fx + ppVar12->scalar;
        ppVar12 = ppVar12 + 1;
      }
    }
  }
  return;
}

Assistant:

inline void vec_add_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  if ((-1e-10 < fx) && (fx < 1e-10))
    return;
  uint64_t mask = mp.weights.mask();
  polyprediction* p = mp.pred;
  fi &= mask;
  uint64_t top = fi + (uint64_t)((mp.count - 1) * mp.step);
  uint64_t i = 0;
  if (top <= mask)
  {
    i += fi;
    for (; i <= top; i += mp.step, ++p)
      p->scalar +=
          fx * mp.weights[i];  // TODO: figure out how to use weight_parameters::iterator (not using change_begin())
  }
  else  // TODO: this could be faster by unrolling into two loops
    for (size_t c = 0; c < mp.count; ++c, fi += (uint64_t)mp.step, ++p)
    {
      fi &= mask;
      p->scalar += fx * mp.weights[fi];
    }
}